

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.c
# Opt level: O3

int wally_sha512(uchar *bytes,size_t bytes_len,uchar *bytes_out,size_t len)

{
  int iVar1;
  
  iVar1 = -2;
  if ((len == 0x40 && bytes_out != (uchar *)0x0) && (bytes_len == 0 || bytes != (uchar *)0x0)) {
    sha512((sha512 *)bytes_out,bytes,bytes_len);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int wally_sha512(const unsigned char *bytes, size_t bytes_len,
                 unsigned char *bytes_out, size_t len)
{
    struct sha512 sha;
    bool aligned = alignment_ok(bytes_out, sizeof(sha.u.u64));

    if ((!bytes && bytes_len != 0) || !bytes_out || len != SHA512_LEN)
        return WALLY_EINVAL;

    sha512(aligned ? (struct sha512 *)bytes_out : &sha, bytes, bytes_len);
    if (!aligned) {
        memcpy(bytes_out, &sha, sizeof(sha));
        wally_clear(&sha, sizeof(sha));
    }
    return WALLY_OK;
}